

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void sync(void)

{
  bool bVar1;
  char *in_RDI;
  bool bVar2;
  char *p;
  int loop;
  char *local_18;
  
  bVar1 = true;
  while (local_18 = in_RDI, bVar1) {
    while( true ) {
      bVar2 = false;
      if ((*local_18 != '\0') && (bVar2 = false, t->id != -1)) {
        bVar2 = (int)*local_18 != t->id;
      }
      if (!bVar2) break;
      local_18 = local_18 + 1;
    }
    if (*local_18 == '\0') {
      next();
    }
    else {
      bVar1 = false;
    }
  }
  return;
}

Assistant:

int sync(const char* accepted)
{
    int loop = 1;
    const char* p;
#ifndef NDEBUG
    printf("Trying to resync with one of : ");
    p = accepted;
    while (*p)
    {
        printf("'%c'", *p);
        ++p;
        if (*p)
            printf(", ");
    }
    printf("\n\tLast token : %s\n\tCurrent : %s\n", token_name(last_id), token_name(t->id));
#endif
    while (loop)
    {
        p = accepted;
        while (*p && t->id != EOF && *p != t->id)
            ++p;

        if (*p)
            loop = 0;
        else
            next();
    }
#ifndef NDEBUG
    printf("\tResult: %s found at %d:%d\n", token_name(t->id), t->line, t->column);
#endif
    return *p == t->id;
}